

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::bt_peer_connection::write_pe_vc_cryptofield
          (bt_peer_connection *this,span<char> write_buf,int crypto_field,int pad_size)

{
  difference_type extraout_RDX;
  unsigned_short val;
  char *pcVar1;
  span<char> buffer;
  span<char> local_30;
  
  pcVar1 = write_buf.m_ptr;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  local_30.m_ptr = pcVar1 + 8;
  local_30.m_len = write_buf.m_len + -8;
  write_impl<unsigned_int,int,char>(crypto_field,&local_30);
  *(ushort *)local_30.m_ptr = (ushort)pad_size << 8 | (ushort)pad_size >> 8;
  local_30.m_ptr = (char *)((long)local_30.m_ptr + 2);
  local_30.m_len = local_30.m_len + -2;
  buffer.m_len = extraout_RDX;
  buffer.m_ptr = (char *)(long)pad_size;
  random_bytes((aux *)local_30.m_ptr,buffer);
  if (((this->super_peer_connection).field_0x885 & 8) != 0) {
    *(undefined2 *)(local_30.m_ptr + pad_size) = 0x4400;
  }
  return;
}

Assistant:

void bt_peer_connection::write_pe_vc_cryptofield(
		span<char> write_buf
		, int const crypto_field
		, int const pad_size)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(crypto_field <= 0x03 && crypto_field > 0);
		// vc,crypto_field,len(pad),pad, (len(ia))
		TORRENT_ASSERT((write_buf.size() >= 8+4+2+pad_size+2
				&& is_outgoing())
			|| (write_buf.size() >= 8+4+2+pad_size && !is_outgoing()));
		TORRENT_ASSERT(!m_sent_handshake);

		// encrypt(vc, crypto_provide/select, len(Pad), len(IA))
		// len(pad) is zero for now, len(IA) only for outgoing connections

		// vc
		std::memset(write_buf.data(), 0, 8);
		write_buf = write_buf.subspan(8);

		aux::write_uint32(crypto_field, write_buf);
		aux::write_uint16(pad_size, write_buf); // len (pad)

		aux::random_bytes(write_buf.first(pad_size));
		write_buf = write_buf.subspan(pad_size);

		// append len(ia) if we are initiating
		if (is_outgoing())
			aux::write_uint16(handshake_len, write_buf); // len(IA)
	}